

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_traceir(lua_State *L)

{
  byte bVar1;
  double *pdVar2;
  int32_t iVar3;
  uint uVar4;
  GCtrace *pGVar5;
  IRIns *pIVar6;
  int iVar7;
  long in_RDI;
  int32_t m;
  IRIns *ir;
  IRRef ref;
  GCtrace *T;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_50;
  
  pGVar5 = jit_checktrace((lua_State *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                         );
  iVar3 = lj_lib_checkint((lua_State *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                          ,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  uVar4 = iVar3 + 0x8000;
  if (((pGVar5 == (GCtrace *)0x0) || (uVar4 < 0x8000)) || (pGVar5->nins <= uVar4)) {
    local_50 = 0;
  }
  else {
    pIVar6 = pGVar5->ir + uVar4;
    bVar1 = lj_ir_mode[(pIVar6->field_1).o];
    *(double *)(*(long *)(in_RDI + 0x18) + -0x10) = (double)bVar1;
    *(double *)(*(long *)(in_RDI + 0x18) + -8) = (double)(pIVar6->field_0).ot;
    pdVar2 = *(double **)(in_RDI + 0x18);
    *(double **)(in_RDI + 0x18) = pdVar2 + 1;
    iVar7 = 0;
    if ((bVar1 & 3) == 0) {
      iVar7 = 0x8000;
    }
    *pdVar2 = (double)(int)((uint)(pIVar6->field_0).op1 - iVar7);
    pdVar2 = *(double **)(in_RDI + 0x18);
    *(double **)(in_RDI + 0x18) = pdVar2 + 1;
    iVar7 = 0;
    if (((int)(uint)bVar1 >> 2 & 3U) == 0) {
      iVar7 = 0x8000;
    }
    *pdVar2 = (double)(int)((uint)(pIVar6->field_0).op2 - iVar7);
    pdVar2 = *(double **)(in_RDI + 0x18);
    *(double **)(in_RDI + 0x18) = pdVar2 + 1;
    *pdVar2 = (double)(pIVar6->field_0).prev;
    local_50 = 5;
  }
  return local_50;
}

Assistant:

LJLIB_CF(jit_util_traceir)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= REF_BIAS && ref < T->nins) {
    IRIns *ir = &T->ir[ref];
    int32_t m = lj_ir_mode[ir->o];
    setintV(L->top-2, m);
    setintV(L->top-1, ir->ot);
    setintV(L->top++, (int32_t)ir->op1 - (irm_op1(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, (int32_t)ir->op2 - (irm_op2(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, ir->prev);
    return 5;
  }
  return 0;
}